

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Allocator alloc;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  char *message;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  size_t __n;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Float FVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  string ret;
  AssertionResult gtest_ar;
  double s;
  SummedAreaTable sat;
  Message local_e8;
  int local_dc;
  Array2D<float> local_d8;
  string local_b8;
  uint local_94;
  double local_90;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  AssertHelper local_70;
  double local_68;
  Bounds2f local_60;
  Array2D<double> local_50;
  
  uVar17 = 0x853c49e6748fea9b;
  local_78 = 0;
  do {
    uVar16 = *(ulong *)((long)&DAT_0055b960 + local_78);
    local_d8.allocator.memoryResource = pstd::pmr::new_delete_resource();
    uVar10 = (uint)(uVar16 >> 0x20);
    uVar18 = (uint)uVar16;
    local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar18 >> 0x1f & uVar18;
    uVar9 = 0;
    if (0 < (int)uVar18) {
      uVar9 = uVar16 & 0xffffffff;
    }
    uVar11 = 0;
    if (uVar10 != 0 && -1 < (long)uVar16) {
      uVar11 = (ulong)uVar10;
    }
    local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar10 >> 0x1f & uVar10;
    local_d8.extent.pMax.super_Tuple2<pbrt::Point2,_int> =
         (Tuple2<pbrt::Point2,_int>)(uVar9 | uVar11 << 0x20);
    uVar13 = -uVar18;
    if (0 < (int)uVar18) {
      uVar13 = uVar18;
    }
    uVar18 = -uVar10;
    if (0 < (int)uVar10) {
      uVar18 = uVar10;
    }
    if (uVar18 * uVar13 == 0) {
      local_d8.values = (float *)0x0;
    }
    else {
      __n = (ulong)(uVar18 * uVar13) << 2;
      iVar5 = (*(local_d8.allocator.memoryResource)->_vptr_memory_resource[2])
                        (local_d8.allocator.memoryResource,__n,4);
      local_d8.values = (float *)CONCAT44(extraout_var,iVar5);
      memset(local_d8.values,0,__n);
    }
    if (local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
        local_d8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
      iVar5 = 0;
      uVar10 = local_d8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
               local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      do {
        if (0 < (int)uVar10) {
          uVar16 = 0;
          do {
            do {
              uVar18 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
              bVar6 = (byte)(uVar17 >> 0x3b);
              uVar18 = uVar18 >> bVar6 | uVar18 << 0x20 - bVar6;
              uVar17 = uVar17 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
            } while ((int)uVar18 < 0);
            iVar7 = (int)uVar16;
            uVar16 = uVar16 + 1;
            local_d8.values
            [(int)((iVar7 - local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) +
                  (iVar5 - local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar10)] =
                 (float)(uVar18 & 0x1f);
          } while (uVar16 != uVar10);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 != local_d8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                        local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::SummedAreaTable((SummedAreaTable *)&local_50,&local_d8,alloc);
    iVar5 = 0;
    do {
      uVar10 = local_d8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
               local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      do {
        uVar18 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
        bVar6 = (byte)(uVar17 >> 0x3b);
        uVar18 = uVar18 >> bVar6 | uVar18 << 0x20 - bVar6;
        uVar17 = uVar17 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar18 < (int)(-uVar10 % uVar10));
      local_94 = local_d8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                 local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      do {
        uVar13 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
        bVar6 = (byte)(uVar17 >> 0x3b);
        uVar13 = uVar13 >> bVar6 | uVar13 << 0x20 - bVar6;
        uVar17 = uVar17 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar13 < (int)(-local_94 % local_94));
      uVar18 = (int)uVar18 % (int)uVar10;
      do {
        uVar15 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
        bVar6 = (byte)(uVar17 >> 0x3b);
        uVar15 = uVar15 >> bVar6 | uVar15 << 0x20 - bVar6;
        uVar17 = uVar17 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar15 < (int)(-uVar10 % uVar10));
      uVar16 = (long)(int)uVar13 % (long)(int)local_94;
      do {
        uVar13 = (uint)(uVar17 >> 0x2d) ^ (uint)(uVar17 >> 0x1b);
        bVar6 = (byte)(uVar17 >> 0x3b);
        uVar13 = uVar13 >> bVar6 | uVar13 << 0x20 - bVar6;
        uVar17 = uVar17 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar13 < (int)(-local_94 % local_94));
      uVar15 = (int)uVar15 % (int)uVar10;
      uVar12 = (uint)uVar16;
      auVar23 = vpinsrd_avx(ZEXT416(local_94),uVar10,1);
      auVar23 = vcvtdq2ps_avx(auVar23);
      uVar9 = (long)(int)uVar13 % (long)(int)local_94;
      uVar13 = uVar18;
      if ((int)uVar15 < (int)uVar18) {
        uVar13 = uVar15;
      }
      uVar8 = (uint)uVar9;
      if ((int)uVar8 < (int)uVar12) {
        uVar16 = uVar9;
      }
      uVar9 = uVar16 & 0xffffffff;
      auVar23._8_8_ = auVar23._0_8_;
      if ((int)uVar15 < (int)uVar18) {
        uVar15 = uVar18;
      }
      uVar18 = uVar8;
      if ((int)uVar8 < (int)uVar12) {
        uVar18 = uVar12;
      }
      auVar21 = vpinsrd_avx(ZEXT416(uVar18),uVar15,1);
      auVar21 = vpinsrd_avx(auVar21,(int)uVar16,2);
      auVar21 = vpinsrd_avx(auVar21,uVar13,3);
      auVar21 = vcvtdq2ps_avx(auVar21);
      auVar23 = vdivps_avx(auVar21,auVar23);
      auVar22 = vshufpd_avx(auVar23,auVar23,1);
      auVar1 = vshufps_avx(auVar23,auVar23,0xff);
      auVar21 = vmovshdup_avx(auVar23);
      uVar16 = vcmpps_avx512vl(auVar23,auVar22,1);
      bVar3 = (byte)(uVar16 >> 2);
      bVar2 = (byte)(uVar16 >> 3);
      bVar6 = (byte)(uVar16 >> 1);
      auVar19._4_12_ = auVar22._4_12_;
      auVar19._0_4_ =
           (uint)((byte)uVar16 & 1) * auVar23._0_4_ +
           (uint)!(bool)((byte)uVar16 & 1) * auVar22._0_4_;
      auVar20._4_12_ = auVar1._4_12_;
      auVar20._0_4_ = (uint)(bVar6 & 1) * auVar21._0_4_ + (uint)!(bool)(bVar6 & 1) * auVar1._0_4_;
      auVar21._0_4_ = (uint)(bVar2 & 1) * auVar21._0_4_ + (uint)!(bool)(bVar2 & 1) * auVar1._0_4_;
      auVar21._4_12_ = auVar20._4_12_;
      auVar22._0_4_ = (uint)(bVar3 & 1) * auVar23._0_4_ + (uint)!(bool)(bVar3 & 1) * auVar22._0_4_;
      auVar22._4_12_ = auVar19._4_12_;
      auVar23 = vinsertps_avx(auVar20,auVar19,0x10);
      auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
      local_60 = (Bounds2f)vmovlhps_avx(auVar23,auVar21);
      auVar26 = ZEXT864(0) << 0x20;
      local_90 = 0.0;
      if (((int)uVar13 < (int)uVar15) && (uVar12 != uVar8)) {
        uVar16 = (ulong)uVar13;
        uVar11 = uVar9 << 0x20;
        do {
          iVar14 = (int)uVar9;
          iVar7 = (int)uVar16;
          uVar12 = iVar7 + 1;
          uVar16 = (uVar11 & 0xffffffff00000000 | (ulong)uVar13) + 0x100000000;
          if (uVar12 != uVar15) {
            uVar16 = (ulong)uVar12 + (uVar11 & 0xffffffff00000000);
          }
          uVar9 = uVar16 >> 0x20;
          local_90 = auVar26._0_8_ +
                     (double)local_d8.values
                             [(int)((iVar14 - local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y
                                    ) * uVar10 +
                                   (iVar7 - local_d8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x))
                             ];
          auVar26 = ZEXT864((ulong)local_90);
          uVar11 = uVar16;
        } while ((uVar13 != (uint)uVar16) || (uVar18 != (uint)(uVar16 >> 0x20)));
      }
      local_90 = local_90 / (double)(int)(local_94 * uVar10);
      local_dc = iVar5;
      FVar24 = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_50,&local_60);
      local_68 = (double)FVar24;
      if ((local_90 != local_68) || (NAN(local_90) || NAN(local_68))) {
        local_e8.ss_.ptr_._0_4_ = 0x3a83126f;
        auVar25._0_8_ = (local_90 - local_68) / local_90;
        auVar25._8_8_ = 0;
        auVar1._8_8_ = 0x7fffffffffffffff;
        auVar1._0_8_ = 0x7fffffffffffffff;
        auVar23 = vandpd_avx512vl(auVar25,auVar1);
        local_b8._M_dataplus._M_p = (pointer)vmovlpd_avx(auVar23);
        testing::internal::CmpHelperLT<double,float>
                  (local_88,"std::abs((ref - s) / ref)","1e-3f",(double *)&local_b8,
                   (float *)&local_e8);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message(&local_e8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          pbrt::detail::stringPrintfRecursive<double&,double&>
                    (&local_b8,"ref %f s %f",&local_90,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(local_e8.ss_.ptr_._4_4_,local_e8.ss_.ptr_._0_4_) + 0x10),
                     local_b8._M_dataplus._M_p,local_b8._M_string_length);
          message = "";
          if (local_80.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = ((local_80.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                     ,0x51d,message);
          testing::internal::AssertHelper::operator=(&local_70,&local_e8);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                     local_b8.field_2._M_local_buf[0]) + 1);
          }
          if (CONCAT44(local_e8.ss_.ptr_._4_4_,local_e8.ss_.ptr_._0_4_) != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               ((long *)CONCAT44(local_e8.ss_.ptr_._4_4_,local_e8.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_e8.ss_.ptr_._4_4_,local_e8.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      iVar5 = local_dc + 1;
    } while (iVar5 != 100);
    pbrt::Array2D<double>::~Array2D(&local_50);
    pbrt::Array2D<float>::~Array2D(&local_d8);
    local_78 = local_78 + 8;
  } while (local_78 != 0x30);
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Integral(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}